

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O3

bool __thiscall
cmTargetIncludeDirectoriesCommand::HandleDirectContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  cmListFileBacktrace lfbt;
  cmValueWithOrigin entry;
  string local_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_78;
  
  cmMakefile::GetBacktrace(&local_a8,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x11])
            (&local_c8,this,content);
  cmValueWithOrigin::cmValueWithOrigin(&local_78,&local_c8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  cmTarget::InsertInclude(tgt,&local_78,prepend);
  if (system) {
    cmTarget::AddSystemIncludeDirectories(tgt,content);
  }
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_78.Backtrace.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Value._M_dataplus._M_p != &local_78.Value.field_2) {
    operator_delete(local_78.Value._M_dataplus._M_p,local_78.Value.field_2._M_allocated_capacity + 1
                   );
  }
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return true;
}

Assistant:

bool cmTargetIncludeDirectoriesCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                      bool prepend, bool system)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmValueWithOrigin entry(this->Join(content), lfbt);
  tgt->InsertInclude(entry, prepend);
  if (system)
    {
    tgt->AddSystemIncludeDirectories(content);
    }
  return true;
}